

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2.h
# Opt level: O2

uint __thiscall cpyp::Corpus::get_or_add_word(Corpus *this,string *word)

{
  mapped_type mVar1;
  uint uVar2;
  mapped_type *__k;
  mapped_type *pmVar3;
  
  __k = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::operator[](&this->wordsToInt,word);
  uVar2 = *__k;
  if (uVar2 == 0) {
    mVar1 = this->max;
    *__k = mVar1;
    this->max = mVar1 + 1;
    pmVar3 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->intToWords,__k);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    this->nwords = this->max;
    uVar2 = *__k;
  }
  return uVar2;
}

Assistant:

inline unsigned get_or_add_word(const std::string& word) {
  unsigned& id = wordsToInt[word];
  if (id == 0) {
    id = max;
    ++max;
    intToWords[id] = word;
    nwords = max;
  }
  return id;
}